

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

bool __thiscall CBlockPolicyEstimator::Write(CBlockPolicyEstimator *this,AutoFile *fileout)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  size_t in_RCX;
  vector<double,_std::allocator<double>_> *extraout_RDX;
  vector<double,_std::allocator<double>_> *extraout_RDX_00;
  vector<double,_std::allocator<double>_> *v;
  long in_FS_OFFSET;
  uint local_34;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock6.super_unique_lock._M_device = &(this->m_cs_fee_estimator).super_mutex;
  criticalblock6.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock6.super_unique_lock);
  local_34 = 0x2498c;
  AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
  local_34 = 0x46c6c;
  AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
  local_34 = this->nBestSeenHeight;
  AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
  uVar2 = BlockSpan(this);
  uVar3 = HistoricalBlockSpan(this);
  if (uVar3 >> 1 < uVar2) {
    local_34 = this->firstRecordedHeight;
    AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
    local_34 = this->nBestSeenHeight;
    AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
    v = extraout_RDX;
  }
  else {
    local_34 = this->historicalFirst;
    AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
    local_34 = this->historicalBest;
    AutoFile::write(fileout,(int)&local_34,(void *)0x4,in_RCX);
    v = extraout_RDX_00;
  }
  VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
  Ser<AutoFile,std::vector<double,std::allocator<double>>>
            ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)fileout,
             (AutoFile *)&this->buckets,v);
  TxConfirmStats::Write
            ((this->feeStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,fileout);
  TxConfirmStats::Write
            ((this->shortStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,fileout);
  TxConfirmStats::Write
            ((this->longStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,fileout);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock6.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Write(AutoFile& fileout) const
{
    try {
        LOCK(m_cs_fee_estimator);
        fileout << 149900; // version required to read: 0.14.99 or later
        fileout << CLIENT_VERSION; // version that wrote the file
        fileout << nBestSeenHeight;
        if (BlockSpan() > HistoricalBlockSpan()/2) {
            fileout << firstRecordedHeight << nBestSeenHeight;
        }
        else {
            fileout << historicalFirst << historicalBest;
        }
        fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(buckets);
        feeStats->Write(fileout);
        shortStats->Write(fileout);
        longStats->Write(fileout);
    }
    catch (const std::exception&) {
        LogPrintf("CBlockPolicyEstimator::Write(): unable to write policy estimator data (non-fatal)\n");
        return false;
    }
    return true;
}